

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

int __thiscall helics::BrokerBase::parseArgs(BrokerBase *this,string_view initializationString)

{
  string_view configString;
  ParseOutput PVar1;
  element_type *this_00;
  long *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  ParseOutput res;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  InvalidParameter *anon_var_0_1;
  InvalidParameter *anon_var_0_2;
  InvalidParameter *anon_var_0;
  ConfigType type;
  undefined1 in_stack_00000397;
  string *in_stack_00000398;
  BrokerBase *in_stack_000003a0;
  undefined1 in_stack_00000ab7;
  string *in_stack_00000ab8;
  BrokerBase *in_stack_00000ac0;
  BrokerBase *in_stack_00000fa8;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  allocator<char> *in_stack_fffffffffffffe00;
  allocator<char> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  allocator<char> local_1b9 [33];
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  App *in_stack_fffffffffffffe70;
  undefined1 local_180 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  helicsCLI11App *in_stack_fffffffffffffec0;
  allocator<char> local_119 [57];
  undefined4 local_e0;
  allocator<char> local_91 [56];
  allocator<char> local_59 [53];
  ConfigType local_24;
  ParseOutput local_4;
  
  configString._M_str = in_stack_fffffffffffffe18;
  configString._M_len = (size_t)in_stack_fffffffffffffe10;
  local_24 = fileops::getConfigType(configString);
  switch(local_24) {
  case JSON_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    loadInfoFromJson(in_stack_00000ac0,in_stack_00000ab8,(bool)in_stack_00000ab7);
    std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
    std::allocator<char>::~allocator(local_91);
    std::__cxx11::string::operator=
              (in_stack_fffffffffffffdd0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_4 = OK;
    break;
  case JSON_FILE:
    *(undefined1 *)(in_RDI + 0x4e) = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    loadInfoFromJson(in_stack_00000ac0,in_stack_00000ab8,(bool)in_stack_00000ab7);
    std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
    std::allocator<char>::~allocator(local_59);
    std::__cxx11::string::operator=
              (in_stack_fffffffffffffdd0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_4 = OK;
    break;
  case TOML_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    loadInfoFromToml(in_stack_000003a0,in_stack_00000398,(bool)in_stack_00000397);
    std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
    std::__cxx11::string::operator=
              (in_stack_fffffffffffffdd0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_4 = OK;
    break;
  case TOML_FILE:
    *(undefined1 *)(in_RDI + 0x4e) = 1;
    __a = local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,__a);
    loadInfoFromToml(in_stack_000003a0,in_stack_00000398,(bool)in_stack_00000397);
    std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    std::__cxx11::string::operator=
              (in_stack_fffffffffffffdd0,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_4 = OK;
    break;
  case CMD_LINE:
  case NONE:
  default:
    sVar2 = generateBaseCLI(in_stack_00000fa8);
    (**(code **)(*in_RDI + 0x40))
              (local_180,in_RDI,
               sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x44ae57);
    std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
              ((shared_ptr<CLI::App> *)in_stack_fffffffffffffdd0,
               (shared_ptr<helics::helicsCLI11App> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    CLI::App::add_subcommand
              (in_stack_fffffffffffffe70,
               (App_p *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x44ae94);
    this_00 = CLI::std::
              __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x44aea1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string>
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_1b9);
    local_e0 = 1;
    local_4 = PVar1;
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x44af2f);
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x44af3c);
  }
  return local_4;
}

Assistant:

int BrokerBase::parseArgs(std::string_view initializationString)
{
    auto type = fileops::getConfigType(initializationString);

    switch (type) {
        case fileops::ConfigType::JSON_FILE:
            fileInUse = true;
            loadInfoFromJson(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::JSON_STRING:
            try {
                loadInfoFromJson(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeConfigToml(initializationString)) {
                    try {
                        loadInfoFromToml(std::string(initializationString));
                        configString = initializationString;
                        return 0;
                    }
                    catch (const helics::InvalidParameter&) {
                        if (fileops::looksLikeCommandLine(initializationString)) {
                            break;
                        }
                        throw;
                    }
                }
                throw;
            }
            break;
        case fileops::ConfigType::TOML_FILE:
            fileInUse = true;
            loadInfoFromToml(std::string(initializationString));
            configString = initializationString;
            return 0;
        case fileops::ConfigType::TOML_STRING:
            try {
                loadInfoFromToml(std::string(initializationString));
                configString = initializationString;
                return 0;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeCommandLine(configString)) {
                    break;
                }
                throw;
            }
            break;
        case fileops::ConfigType::CMD_LINE:
        case fileops::ConfigType::NONE:
            // with NONE there are default command line and environment possibilities
            break;
    }

    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(std::string(initializationString));
    return static_cast<int>(res);
}